

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O2

void __thiscall
singleParticleSpectra::output_four_particle_Cn4_correlation(singleParticleSpectra *this)

{
  char *pcVar1;
  ostream *poVar2;
  int i;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double local_3d8;
  char *local_3c0 [4];
  ofstream output;
  undefined8 auStack_398 [2];
  uint auStack_388 [122];
  ostringstream filename;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename);
  if (this->rap_type == 0) {
    poVar2 = std::operator<<((ostream *)&filename,(string *)this);
    poVar2 = std::operator<<(poVar2,"/particle_");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->particle_monval);
    poVar2 = std::operator<<(poVar2,"_Cn4");
    pcVar1 = "_Cmnk_os_eta_";
  }
  else {
    poVar2 = std::operator<<((ostream *)&filename,(string *)this);
    poVar2 = std::operator<<(poVar2,"/particle_");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->particle_monval);
    poVar2 = std::operator<<(poVar2,"_Cn4");
    pcVar1 = "_Cmnk_os_y_";
  }
  std::operator<<(poVar2,pcVar1 + 8);
  poVar2 = std::ostream::_M_insert<double>(this->rap_min);
  std::operator<<(poVar2,"_");
  poVar2 = std::ostream::_M_insert<double>(this->rap_max);
  std::operator<<(poVar2,".dat");
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&output,local_3c0[0],_S_out);
  std::__cxx11::string::~string((string *)local_3c0);
  poVar2 = std::operator<<((ostream *)&output,"# n  Cn4  Cn4_err");
  std::endl<char,std::char_traits<char>>(poVar2);
  dVar5 = (double)this->total_number_of_events;
  dVar6 = *(this->Cn4).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start / dVar5;
  dVar4 = *(this->Cn4_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start / dVar5 - dVar6 * dVar6;
  local_3d8 = 0.0;
  if (0.0 < dVar4) {
    dVar4 = dVar4 / dVar5;
    if (dVar4 < 0.0) {
      local_3d8 = sqrt(dVar4);
    }
    else {
      local_3d8 = SQRT(dVar4);
    }
  }
  *(uint *)((long)auStack_388 + *(long *)(_output + -0x18)) =
       *(uint *)((long)auStack_388 + *(long *)(_output + -0x18)) & 0xfffffefb | 0x100;
  *(undefined8 *)((long)auStack_398 + *(long *)(_output + -0x18) + 8) = 0x12;
  *(undefined8 *)((long)auStack_398 + *(long *)(_output + -0x18)) = 8;
  poVar2 = (ostream *)std::ostream::operator<<(&output,0);
  std::operator<<(poVar2,"  ");
  poVar2 = std::ostream::_M_insert<double>(dVar6);
  std::operator<<(poVar2,"  ");
  poVar2 = std::ostream::_M_insert<double>(local_3d8);
  std::endl<char,std::char_traits<char>>(poVar2);
  for (lVar3 = 1; lVar3 < this->num_Cn4; lVar3 = lVar3 + 1) {
    dVar5 = (double)this->total_number_of_events;
    dVar7 = (this->Cn4).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar3] / dVar5;
    dVar4 = (this->Cn4_err).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar3] / dVar5 - dVar7 * dVar7;
    local_3d8 = 0.0;
    if (0.0 < dVar4) {
      dVar4 = dVar4 / dVar5;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      local_3d8 = dVar4 / dVar6;
    }
    *(uint *)((long)auStack_388 + *(long *)(_output + -0x18)) =
         *(uint *)((long)auStack_388 + *(long *)(_output + -0x18)) & 0xfffffefb | 0x100;
    *(undefined8 *)((long)auStack_398 + *(long *)(_output + -0x18) + 8) = 0x12;
    *(undefined8 *)((long)auStack_398 + *(long *)(_output + -0x18)) = 8;
    poVar2 = (ostream *)std::ostream::operator<<(&output,(int)lVar3);
    std::operator<<(poVar2,"  ");
    poVar2 = std::ostream::_M_insert<double>(dVar7 / dVar6);
    std::operator<<(poVar2,"  ");
    poVar2 = std::ostream::_M_insert<double>(local_3d8);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::ofstream::~ofstream(&output);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename);
  return;
}

Assistant:

void singleParticleSpectra::output_four_particle_Cn4_correlation() {
    ostringstream filename;
    if (rap_type == 0) {
        filename << path_ << "/particle_" << particle_monval << "_Cn4"
                 << "_eta_" << rap_min << "_" << rap_max << ".dat";
    } else {
        filename << path_ << "/particle_" << particle_monval << "_Cn4"
                 << "_y_" << rap_min << "_" << rap_max << ".dat";
    }
    ofstream output(filename.str().c_str());
    output << "# n  Cn4  Cn4_err" << endl;
    double num_pair = Cn4[0] / total_number_of_events;
    double num_pair_stdsq =
        (Cn4_err[0] / total_number_of_events - num_pair * num_pair);
    double num_pair_err = 0.0;
    if (num_pair_stdsq > 0) {
        num_pair_err = sqrt(num_pair_stdsq / total_number_of_events);
    }
    output << scientific << setw(18) << setprecision(8) << 0 << "  " << num_pair
           << "  " << num_pair_err << endl;
    for (int i = 1; i < num_Cn4; i++) {
        double Cn4_avg = Cn4[i] / total_number_of_events;
        double Cn4_stdsq =
            (Cn4_err[i] / total_number_of_events - Cn4_avg * Cn4_avg);
        Cn4_avg = Cn4_avg / num_pair;
        double Cn4_avg_err = 0.0;
        if (Cn4_stdsq > 0) {
            Cn4_avg_err = sqrt(Cn4_stdsq / total_number_of_events);
            Cn4_avg_err = Cn4_avg_err / num_pair;
        }
        output << scientific << setw(18) << setprecision(8) << i << "  "
               << Cn4_avg << "  " << Cn4_avg_err << endl;
    }
}